

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O0

GCfunc * lj_func_newL_empty(lua_State *L,GCproto *pt,GCtab *env)

{
  byte bVar1;
  uint uVar2;
  GCfunc *pGVar3;
  GCupval *pGVar4;
  int32_t v;
  GCupval *uv;
  MSize nuv;
  MSize i;
  GCfunc *fn;
  GCtab *env_local;
  GCproto *pt_local;
  lua_State *L_local;
  
  pGVar3 = func_newL(L,pt,env);
  bVar1 = pt->sizeuv;
  for (uv._4_4_ = 0; uv._4_4_ < bVar1; uv._4_4_ = uv._4_4_ + 1) {
    pGVar4 = func_emptyuv(L);
    uVar2 = (uint)*(ushort *)((pt->uv).ptr64 + (ulong)uv._4_4_ * 2);
    pGVar4->immutable = (byte)(uVar2 / 0x4000) & 1;
    pGVar4->dhash = (uint)pt ^ uVar2 << 0x18;
    *(GCupval **)((long)pGVar3 + (ulong)uv._4_4_ * 8 + 0x28) = pGVar4;
  }
  (pGVar3->c).nupvalues = bVar1;
  return pGVar3;
}

Assistant:

GCfunc *lj_func_newL_empty(lua_State *L, GCproto *pt, GCtab *env)
{
  GCfunc *fn = func_newL(L, pt, env);
  MSize i, nuv = pt->sizeuv;
  /* NOBARRIER: The GCfunc is new (marked white). */
  for (i = 0; i < nuv; i++) {
    GCupval *uv = func_emptyuv(L);
    int32_t v = proto_uv(pt)[i];
    uv->immutable = ((v / PROTO_UV_IMMUTABLE) & 1);
    uv->dhash = (uint32_t)(uintptr_t)pt ^ (v << 24);
    setgcref(fn->l.uvptr[i], obj2gco(uv));
  }
  fn->l.nupvalues = (uint8_t)nuv;
  return fn;
}